

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demandmodel.cpp
# Opt level: O2

void __thiscall LogisticDemandModel::setCoeffs(LogisticDemandModel *this,double pMin,double pFull)

{
  this->a = (pFull * -4.595 + pMin * -6.907) / (pFull - pMin);
  this->b = 11.502 / (pFull - pMin);
  return;
}

Assistant:

void  LogisticDemandModel::setCoeffs(double pMin, double pFull)
{
    // ... computes logistic function coefficients
    //     assuming 99.9% of full demand at full pressure
    //     and 1% of full demand at minimum pressure.

    double pRange = pFull - pMin;
    a = (-4.595 * pFull - 6.907 * pMin) / pRange;
    b = 11.502 / pRange;
}